

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
* deqp::gles31::Functional::anon_unknown_0::makePixelOffsetsFunctor
            (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
             *__return_storage_ptr__,GatherType gatherType,GatherArgs *gatherArgs,IVec2 *offsetRange
            )

{
  _func_int **pp_Var1;
  SinglePixelOffsets *this;
  PixelOffsets *pPVar2;
  IVec2 offset;
  
  if (gatherType < GATHERTYPE_OFFSET_DYNAMIC) {
    if (gatherType == GATHERTYPE_BASIC) {
      offset.m_data[0] = 0;
      offset.m_data[1] = 0;
    }
    else {
      tcu::Vector<int,_2>::Vector(&offset,gatherArgs->offsets);
    }
    this = (SinglePixelOffsets *)operator_new(0x28);
    SinglePixelOffsets::SinglePixelOffsets(this,&offset);
  }
  else {
    if (gatherType == GATHERTYPE_OFFSETS) {
      pPVar2 = (PixelOffsets *)operator_new(0x28);
      pPVar2->_vptr_PixelOffsets = (_func_int **)&PTR_operator___00a1aea0;
      pp_Var1 = *(_func_int ***)gatherArgs->offsets[1].m_data;
      pPVar2[1]._vptr_PixelOffsets = *(_func_int ***)gatherArgs->offsets[0].m_data;
      pPVar2[2]._vptr_PixelOffsets = pp_Var1;
      pp_Var1 = *(_func_int ***)gatherArgs->offsets[3].m_data;
      pPVar2[3]._vptr_PixelOffsets = *(_func_int ***)gatherArgs->offsets[2].m_data;
      pPVar2[4]._vptr_PixelOffsets = pp_Var1;
      (__return_storage_ptr__->
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
      ).m_data.ptr = pPVar2;
      return __return_storage_ptr__;
    }
    if (gatherType != GATHERTYPE_OFFSET_DYNAMIC) {
      (__return_storage_ptr__->
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
      ).m_data.ptr = (PixelOffsets *)0x0;
      return __return_storage_ptr__;
    }
    this = (SinglePixelOffsets *)operator_new(0x10);
    (this->super_MultiplePixelOffsets).super_PixelOffsets._vptr_PixelOffsets =
         (_func_int **)&PTR_operator___00a1aec8;
    tcu::Vector<int,_2>::Vector((this->super_MultiplePixelOffsets).m_offsets,offsetRange);
  }
  (__return_storage_ptr__->
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  ).m_data.ptr = (PixelOffsets *)this;
  return __return_storage_ptr__;
}

Assistant:

static MovePtr<PixelOffsets> makePixelOffsetsFunctor (GatherType gatherType, const GatherArgs& gatherArgs, const IVec2& offsetRange)
{
	if (gatherType == GATHERTYPE_BASIC || gatherType == GATHERTYPE_OFFSET)
	{
		const IVec2 offset = gatherType == GATHERTYPE_BASIC ? IVec2(0) : gatherArgs.offsets[0];
		return MovePtr<PixelOffsets>(new SinglePixelOffsets(offset));
	}
	else if (gatherType == GATHERTYPE_OFFSET_DYNAMIC)
	{
		return MovePtr<PixelOffsets>(new DynamicSinglePixelOffsets(offsetRange));
	}
	else if (gatherType == GATHERTYPE_OFFSETS)
		return MovePtr<PixelOffsets>(new MultiplePixelOffsets(gatherArgs.offsets[0],
															  gatherArgs.offsets[1],
															  gatherArgs.offsets[2],
															  gatherArgs.offsets[3]));
	else
	{
		DE_ASSERT(false);
		return MovePtr<PixelOffsets>(DE_NULL);
	}
}